

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerMeshless::ChProximityContainerMeshless
          (ChProximityContainerMeshless *this,ChProximityContainerMeshless *other)

{
  list<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_> *plVar1;
  
  ChProximityContainer::ChProximityContainer
            (&this->super_ChProximityContainer,&other->super_ChProximityContainer);
  (this->super_ChProximityContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChProximityContainerMeshless_00b4fd78;
  plVar1 = &this->proximitylist;
  (this->proximitylist).
  super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->proximitylist).
  super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->proximitylist).
  super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>.
  _M_impl._M_node._M_size = 0;
  (this->lastproximity)._M_node = (_List_node_base *)0x0;
  this->n_added = other->n_added;
  if (this != other) {
    std::__cxx11::list<chrono::ChProximityMeshless*,std::allocator<chrono::ChProximityMeshless*>>::
    _M_assign_dispatch<std::_List_const_iterator<chrono::ChProximityMeshless*>>
              ((list<chrono::ChProximityMeshless*,std::allocator<chrono::ChProximityMeshless*>> *)
               plVar1,(other->proximitylist).
                      super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next,&other->proximitylist);
  }
  (this->lastproximity)._M_node =
       (this->proximitylist).
       super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  return;
}

Assistant:

ChProximityContainerMeshless::ChProximityContainerMeshless(const ChProximityContainerMeshless& other)
    : ChProximityContainer(other) {
    n_added = other.n_added;
    proximitylist = other.proximitylist;
    lastproximity = proximitylist.begin();
}